

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3Insert(Parse *pParse,SrcList *pTabList,Select *pSelect,IdList *pColumn,int onError,
                  Upsert *pUpsert)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  short sVar4;
  uint uVar5;
  sqlite3 *db;
  sqlite3 *db_00;
  IdList_item *pIVar6;
  char *z;
  ExprList *pEVar7;
  Expr *pEVar8;
  Index *pIVar9;
  SrcList *pSVar10;
  Column *pCVar11;
  Column *pCVar12;
  long lVar13;
  Index *pIVar14;
  u32 uVar15;
  char cVar16;
  ushort uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  Table *pTab;
  Trigger *pTVar24;
  Vdbe *p;
  ExprList_item *pEVar25;
  Index **ppIVar26;
  Vdbe *pVVar27;
  VdbeOp *pVVar28;
  Table *pTVar29;
  VTable *pVVar30;
  Parse *pPVar31;
  FKey *pFVar32;
  ushort uVar33;
  uint uVar34;
  int iVar35;
  undefined1 *puVar36;
  long lVar37;
  ulong uVar38;
  int iVar39;
  ulong uVar40;
  u16 uVar41;
  anon_union_8_3_1bb8468b_for_uNC pB;
  ExprList *pList;
  uint p2;
  uint uVar42;
  undefined4 in_register_00000084;
  undefined8 uVar43;
  undefined1 *puVar44;
  ulong uVar45;
  byte bVar46;
  long lVar47;
  Select *pSVar48;
  bool bVar49;
  byte local_230;
  undefined1 *local_220;
  Index **local_1f8;
  int *local_1c8;
  int iDataCur;
  ExprList_item *local_198;
  ulong local_190;
  Trigger *local_188;
  int local_17c;
  int local_178;
  int iIdxCur;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  undefined8 local_158;
  undefined8 local_150;
  int tmask;
  undefined8 local_140;
  Select *local_138;
  ulong local_130;
  ulong local_128;
  ExprList_item *local_120;
  SelectDest local_118;
  int isReplace;
  SrcList *local_f0;
  anon_union_8_3_1bb8468b_for_uNC aStack_e8;
  NameContext *local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  Select *pSStack_c8;
  undefined1 local_b0 [44];
  undefined4 local_84;
  short local_80;
  NameContext local_68;
  
  uVar43 = CONCAT44(in_register_00000084,onError);
  iDataCur = 0;
  iIdxCur = 0;
  db = pParse->db;
  if ((pParse->nErr != 0) || (db->mallocFailed != '\0')) {
    local_1c8 = (int *)0x0;
    pList = (ExprList *)0x0;
    goto LAB_0015da53;
  }
  local_118.iSDParm = 0;
  local_150 = uVar43;
  if (pSelect == (Select *)0x0) {
    pList = (ExprList *)0x0;
LAB_0015daf0:
    pSelect = (Select *)0x0;
  }
  else {
    if (((pSelect->selFlags & 0x200) != 0) && (pSelect->pPrior == (Select *)0x0)) {
      pList = pSelect->pEList;
      pSelect->pEList = (ExprList *)0x0;
      sqlite3SelectDelete(db,pSelect);
      goto LAB_0015daf0;
    }
    pList = (ExprList *)0x0;
  }
  pTab = sqlite3SrcListLookup(pParse,pTabList);
  if (pTab == (Table *)0x0) {
    local_1c8 = (int *)0x0;
    goto LAB_0015da53;
  }
  iVar18 = sqlite3SchemaToIndex(db,pTab->pSchema);
  iVar19 = sqlite3AuthCheck(pParse,0x12,pTab->zName,(char *)0x0,db->aDb[iVar18].zDbSName);
  if (iVar19 == 0) {
    local_190 = CONCAT44(local_190._4_4_,iVar18);
    uVar15 = pTab->tabFlags;
    pTVar24 = sqlite3TriggersExist(pParse,pTab,0x78,(ExprList *)0x0,&tmask);
    pSVar48 = pTab->pSelect;
    iVar18 = sqlite3ViewGetColumnNames(pParse,pTab);
    if (iVar18 == 0) {
      local_188 = pTVar24;
      local_138 = pSVar48;
      iVar18 = sqlite3IsReadOnly(pParse,pTab,tmask);
      if ((iVar18 != 0) || (p = sqlite3GetVdbe(pParse), p == (Vdbe *)0x0)) {
        local_1c8 = (int *)0x0;
        goto LAB_0015da53;
      }
      if (pParse->nested == '\0') {
        p->field_0xc5 = p->field_0xc5 | 0x20;
      }
      sqlite3BeginWriteOperation
                (pParse,(uint)(pSelect != (Select *)0x0 || local_188 != (Trigger *)0x0),
                 (int)local_190);
      if ((((pColumn == (IdList *)0x0) && (pSelect != (Select *)0x0)) &&
          (pParse->pWith == (With *)0x0)) && (pSelect->pWith == (With *)0x0)) {
        db_00 = pParse->db;
        pTVar24 = sqlite3TriggerList(pParse,pTab);
        if ((pTVar24 != (Trigger *)0x0) || (pTab->nModuleArg != 0)) goto LAB_0015dc56;
        local_1c8._0_4_ = (uint)local_150;
        if ((uint)local_1c8 == 0xb) {
          if ((pTab->iPKey < 0) || (pTab->keyConf == 0xb)) {
            local_1c8._0_4_ = 2;
          }
          else {
            local_1c8._0_4_ = (uint)pTab->keyConf;
          }
        }
        pSVar10 = pSelect->pSrc;
        if ((((((pSVar10->nSrc != 1) || (pSVar10->a[0].pSelect != (Select *)0x0)) ||
              (pSelect->pWhere != (Expr *)0x0)) ||
             (((pSelect->pOrderBy != (ExprList *)0x0 || (pSelect->pGroupBy != (ExprList *)0x0)) ||
              ((pSelect->pLimit != (Expr *)0x0 ||
               ((pSelect->pPrior != (Select *)0x0 || ((pSelect->selFlags & 1) != 0)))))))) ||
            ((pSelect->pEList->nExpr != 1 ||
             (((pSelect->pEList->a[0].pExpr)->op != 0xac ||
              (pTVar29 = sqlite3LocateTableItem(pParse,0,pSVar10->a), pTVar29 == (Table *)0x0))))))
           || ((((pTVar29->tnum == pTab->tnum && (pTVar29->pSchema == pTab->pSchema)) ||
                (((((pTVar29->tabFlags ^ pTab->tabFlags) & 0x20) != 0 || (pTVar29->nModuleArg != 0))
                 || (pTVar29->pSelect != (Select *)0x0)))) ||
               ((uVar17 = pTab->nCol, uVar17 != pTVar29->nCol || (pTab->iPKey != pTVar29->iPKey)))))
           ) goto LAB_0015dc56;
        lVar47 = 0;
        uVar33 = 0;
        if (0 < (short)uVar17) {
          uVar33 = uVar17;
        }
        for (; (ulong)uVar33 << 5 != lVar47; lVar47 = lVar47 + 0x20) {
          pCVar11 = pTab->aCol;
          pCVar12 = pTVar29->aCol;
          if ((((&pCVar11->affinity)[lVar47] != (&pCVar12->affinity)[lVar47]) ||
              (iVar18 = sqlite3_stricmp(*(char **)((long)&pCVar11->zColl + lVar47),
                                        *(char **)((long)&pCVar12->zColl + lVar47)), iVar18 != 0))
             || (((&pCVar11->notNull)[lVar47] != '\0' && ((&pCVar12->notNull)[lVar47] == '\0'))))
          goto LAB_0015dc56;
          if (lVar47 != 0) {
            lVar37 = *(long *)((long)&pCVar11->pDflt + lVar47);
            lVar13 = *(long *)((long)&pCVar12->pDflt + lVar47);
            if (((lVar37 == 0) == (lVar13 != 0)) ||
               ((lVar37 != 0 &&
                (iVar18 = strcmp(*(char **)(lVar37 + 8),*(char **)(lVar13 + 8)), iVar18 != 0))))
            goto LAB_0015dc56;
          }
        }
        local_198 = (ExprList_item *)&pTVar29->pIndex;
        bVar49 = false;
        local_1f8 = &pTab->pIndex;
        ppIVar26 = local_1f8;
        while (pIVar9 = *ppIVar26, pIVar9 != (Index *)0x0) {
          pEVar25 = local_198;
          if (pIVar9->onError != '\0') {
            bVar49 = true;
          }
          while( true ) {
            pIVar14 = (Index *)pEVar25->pExpr;
            if (pIVar14 == (Index *)0x0) goto LAB_0015dc56;
            iVar18 = xferCompatibleIndex(pIVar9,pIVar14);
            if (iVar18 != 0) break;
            pEVar25 = (ExprList_item *)&pIVar14->pNext;
          }
          if (((pIVar14->tnum == pIVar9->tnum) && (pTVar29->pSchema == pTab->pSchema)) &&
             ((sqlite3Config.xTestCallback == (_func_int_int *)0x0 ||
              (iVar18 = (*sqlite3Config.xTestCallback)(0x19b), iVar18 == 0)))) goto LAB_0015dc56;
          ppIVar26 = &pIVar9->pNext;
        }
        if ((pTab->pCheck != (ExprList *)0x0) &&
           (iVar18 = sqlite3ExprListCompare(pTVar29->pCheck,pTab->pCheck,-1), iVar18 != 0))
        goto LAB_0015dc56;
        cVar16 = (char)db_00->flags;
        if (((uint)db_00->flags >> 0xe & 1) != 0) {
          if ((-1 < cVar16) && (pTab->pFKey == (FKey *)0x0)) goto LAB_0015f48a;
          goto LAB_0015dc56;
        }
        if (cVar16 < '\0') goto LAB_0015dc56;
LAB_0015f48a:
        iVar21 = sqlite3SchemaToIndex(db_00,pTVar29->pSchema);
        pVVar27 = sqlite3GetVdbe(pParse);
        sqlite3CodeVerifySchema(pParse,iVar21);
        iVar18 = pParse->nTab;
        iVar39 = iVar18 + 1;
        pParse->nTab = iVar18 + 2;
        iVar19 = (int)local_190;
        iVar23 = autoIncBegin(pParse,(int)local_190,pTab);
        local_170 = CONCAT44(local_170._4_4_,iVar23);
        iVar23 = sqlite3GetTempReg(pParse);
        iVar20 = sqlite3GetTempReg(pParse);
        sqlite3OpenTable(pParse,iVar39,iVar19,pTab,0x6d);
        local_158 = (Vdbe *)((ulong)local_158._4_4_ << 0x20);
        if (((db_00->mDbFlags & 4) == 0) &&
           ((((pTab->iPKey < 0 && (*local_1f8 != (Index *)0x0)) || (bVar49)) ||
            ((uint)local_1c8 - 3 < 0xfffffffe)))) {
          iVar19 = sqlite3VdbeAddOp2(pVVar27,0x24,iVar39,0);
          iVar22 = sqlite3VdbeAddOp0(pVVar27,0xb);
          local_158 = (Vdbe *)CONCAT44(local_158._4_4_,iVar22);
          sqlite3VdbeJumpHere(pVVar27,iVar19);
        }
        if ((pTVar29->tabFlags & 0x20) == 0) {
          sqlite3OpenTable(pParse,iVar18,iVar21,pTVar29,0x6c);
          iVar19 = sqlite3VdbeAddOp2(pVVar27,0x24,iVar18,0);
          if (pTab->iPKey < 0) {
            if ((*local_1f8 == (Index *)0x0) && ((db_00->mDbFlags & 8) == 0)) {
              iVar22 = 0x79;
              iVar35 = iVar39;
            }
            else {
              iVar22 = 0x80;
              iVar35 = iVar18;
            }
            iVar22 = sqlite3VdbeAddOp2(pVVar27,iVar22,iVar35,iVar20);
          }
          else {
            iVar22 = sqlite3VdbeAddOp2(pVVar27,0x80,iVar18,iVar20);
            iVar35 = sqlite3VdbeAddOp3(pVVar27,0x1f,iVar39,0,iVar20);
            sqlite3RowidConstraint(pParse,(uint)local_1c8,pTab);
            sqlite3VdbeJumpHere(pVVar27,iVar35);
            autoIncStep(pParse,(int)local_170,iVar20);
          }
          sqlite3VdbeAddOp3(pVVar27,0x7f,iVar18,iVar23,1);
          uVar41 = 0x29;
          if ((db_00->mDbFlags & 4) != 0) {
            sqlite3VdbeAddOp1(pVVar27,0x82,iVar39);
            uVar41 = 0x39;
          }
          sqlite3VdbeAddOp4(pVVar27,0x7a,iVar39,iVar23,iVar20,(char *)pTab,-6);
          if (0 < (long)pVVar27->nOp) {
            pVVar27->aOp[(long)pVVar27->nOp + -1].p5 = uVar41;
          }
          sqlite3VdbeAddOp2(pVVar27,5,iVar18,iVar22);
          sqlite3VdbeAddOp2(pVVar27,0x75,iVar18,0);
          sqlite3VdbeAddOp2(pVVar27,0x75,iVar39,0);
        }
        else {
          sqlite3TableLock(pParse,(int)local_190,pTab->tnum,'\x01',pTab->zName);
          iVar19 = 0;
          sqlite3TableLock(pParse,iVar21,pTVar29->tnum,'\0',pTVar29->zName);
        }
        while (pIVar9 = *local_1f8, pEVar25 = local_198, pIVar9 != (Index *)0x0) {
          while ((pIVar14 = (Index *)pEVar25->pExpr, pIVar14 != (Index *)0x0 &&
                 (iVar22 = xferCompatibleIndex(pIVar9,pIVar14), iVar22 == 0))) {
            pEVar25 = (ExprList_item *)&pIVar14->pNext;
          }
          sqlite3VdbeAddOp3(pVVar27,0x6c,iVar18,pIVar14->tnum,iVar21);
          sqlite3VdbeSetP4KeyInfo(pParse,pIVar14);
          sqlite3VdbeAddOp3(pVVar27,0x6d,iVar39,pIVar9->tnum,(int)local_190);
          sqlite3VdbeSetP4KeyInfo(pParse,pIVar9);
          if (0 < (long)pVVar27->nOp) {
            pVVar27->aOp[(long)pVVar27->nOp + -1].p5 = 1;
          }
          bVar46 = 0;
          iVar22 = sqlite3VdbeAddOp2(pVVar27,0x24,iVar18,0);
          sqlite3VdbeAddOp3(pVVar27,0x7f,iVar18,iVar23,1);
          if ((db_00->mDbFlags & 4) != 0) {
            uVar17 = pIVar14->nColumn;
            for (uVar40 = 0; uVar17 != uVar40; uVar40 = uVar40 + 1) {
              iVar35 = sqlite3_stricmp("BINARY",pIVar14->azColl[uVar40]);
              if (iVar35 != 0) {
                if (uVar17 != uVar40) {
                  bVar46 = 0;
                  goto LAB_0015f8dd;
                }
                break;
              }
            }
            sqlite3VdbeAddOp1(pVVar27,0x82,iVar39);
            bVar46 = 0x10;
          }
LAB_0015f8dd:
          if ((pTVar29->tabFlags & 0x20) != 0) {
            bVar46 = bVar46 | (*(ushort *)&pIVar9->field_0x63 & 3) == 2;
          }
          sqlite3VdbeAddOp2(pVVar27,0x84,iVar39,iVar23);
          if (0 < (long)pVVar27->nOp) {
            pVVar27->aOp[(long)pVVar27->nOp + -1].p5 = (ushort)(bVar46 | 8);
          }
          sqlite3VdbeAddOp2(pVVar27,5,iVar18,iVar22 + 1);
          sqlite3VdbeJumpHere(pVVar27,iVar22);
          sqlite3VdbeAddOp2(pVVar27,0x75,iVar18,0);
          sqlite3VdbeAddOp2(pVVar27,0x75,iVar39,0);
          local_1f8 = &pIVar9->pNext;
        }
        if (iVar19 != 0) {
          sqlite3VdbeJumpHere(pVVar27,iVar19);
        }
        if (iVar20 != 0) {
          bVar46 = pParse->nTempReg;
          if ((ulong)bVar46 < 8) {
            pParse->nTempReg = bVar46 + 1;
            pParse->aTempReg[bVar46] = iVar20;
          }
        }
        if (iVar23 != 0) {
          bVar46 = pParse->nTempReg;
          if ((ulong)bVar46 < 8) {
            pParse->nTempReg = bVar46 + 1;
            pParse->aTempReg[bVar46] = iVar23;
          }
        }
        if ((int)local_158 != 0) {
          sqlite3AutoincrementEnd(pParse);
          sqlite3VdbeAddOp2(pVVar27,0x45,0,0);
          sqlite3VdbeJumpHere(pVVar27,(int)local_158);
          sqlite3VdbeAddOp2(pVVar27,0x75,iVar39,0);
          goto LAB_0015dc56;
        }
        iVar21 = 0;
        local_1c8 = (int *)0x0;
      }
      else {
LAB_0015dc56:
        iVar20 = autoIncBegin(pParse,(int)local_190,pTab);
        iVar21 = pParse->nMem;
        iVar18 = iVar21 + 1;
        sVar4 = pTab->nCol;
        iVar19 = iVar21 + sVar4;
        iVar39 = iVar19 + 1;
        pParse->nMem = iVar39;
        iVar23 = iVar18;
        if (pTab->nModuleArg != 0) {
          iVar39 = iVar19 + 2;
          pParse->nMem = iVar39;
          iVar23 = iVar21 + 2;
        }
        bVar46 = (byte)uVar15 >> 5;
        bVar49 = (pTab->tabFlags & 0x80) == 0;
        if (pColumn == (IdList *)0x0) {
          local_220 = (undefined1 *)0xffffffffffffffff;
        }
        else {
          pEVar25 = (ExprList_item *)0x0;
          local_198 = (ExprList_item *)(ulong)(uint)pColumn->nId;
          if (pColumn->nId < 1) {
            local_198 = pEVar25;
          }
          for (; (ExprList_item *)((long)local_198 * 0x10) != pEVar25;
              pEVar25 = (ExprList_item *)&pEVar25->zSpan) {
            *(undefined4 *)((long)&pEVar25->zName + (long)pColumn->a) = 0xffffffff;
          }
          uVar34 = (int)sVar4;
          if (sVar4 < 1) {
            uVar34 = 0;
          }
          local_220 = (undefined1 *)0xffffffffffffffff;
          local_230 = bVar46 & 1;
          for (puVar36 = (undefined1 *)0x0; (ExprList_item *)puVar36 != local_198;
              puVar36 = puVar36 + 1) {
            pIVar6 = pColumn->a;
            z = pIVar6[(long)puVar36].zName;
            lVar47 = 0;
            for (puVar44 = (undefined1 *)0x0; (undefined1 *)(ulong)uVar34 != puVar44;
                puVar44 = puVar44 + 1) {
              iVar19 = sqlite3StrICmp(z,*(char **)((long)&pTab->aCol->zName + lVar47));
              if (iVar19 == 0) {
                pIVar6[(long)puVar36].idx = (int)puVar44;
                if (puVar36 != puVar44) {
                  bVar49 = false;
                }
                if ((undefined1 *)(long)pTab->iPKey == puVar44) {
                  local_220 = puVar36;
                }
                goto LAB_0015dea6;
              }
              lVar47 = lVar47 + 0x20;
            }
            iVar19 = sqlite3IsRowid(z);
            if ((iVar19 == 0) || (local_230 != 0)) {
              sqlite3ErrorMsg(pParse,"table %S has no column named %s",pTabList,0,z);
              pParse->checkSchema = '\x01';
              goto LAB_0015e05a;
            }
            bVar49 = false;
            local_220 = puVar36;
LAB_0015dea6:
            local_220 = (undefined1 *)((ulong)local_220 & 0xffffffff);
          }
        }
        uVar34 = iVar23 + 1;
        if (pSelect == (Select *)0x0) {
          local_d0._0_2_ = 0;
          local_d0._2_6_ = 0;
          pSStack_c8 = (Select *)0x0;
          local_e0 = (NameContext *)0x0;
          uStack_d8._0_4_ = 0;
          uStack_d8._4_4_ = 0;
          local_f0 = (SrcList *)0x0;
          aStack_e8.pEList = (ExprList *)0x0;
          local_170 = 0;
          p2 = 0;
          _isReplace = pParse;
          if (pList != (ExprList *)0x0) {
            p2 = pList->nExpr;
            iVar19 = sqlite3ResolveExprListNames((NameContext *)&isReplace,pList);
            if (iVar19 != 0) {
              local_1c8 = (int *)0x0;
              pSelect = (Select *)0x0;
              goto LAB_0015da53;
            }
          }
          iVar19 = -1;
          bVar2 = 0;
        }
        else {
          iVar39 = iVar39 + 1;
          pParse->nMem = iVar39;
          iVar19 = p->nOp;
          sqlite3VdbeAddOp3(p,0xd,iVar39,0,iVar19 + 1);
          local_118.eDest = '\r';
          local_118.zAffSdst = (char *)0x0;
          local_118.iSdst = uVar34;
          if (!bVar49) {
            local_118.iSdst = 0;
          }
          local_118.nSdst = (int)pTab->nCol;
          local_118.iSDParm = iVar39;
          iVar21 = sqlite3Select(pParse,pSelect,&local_118);
          if (iVar21 != 0) {
            local_1c8 = (int *)0x0;
            goto LAB_0015da53;
          }
          if ((db->mallocFailed != '\0') || (pParse->nErr != 0)) {
LAB_0015e05a:
            local_1c8 = (int *)0x0;
            goto LAB_0015da53;
          }
          local_170 = (ulong)(uint)local_118.iSdst;
          sqlite3VdbeEndCoroutine(p,iVar39);
          sqlite3VdbeJumpHere(p,iVar19);
          p2 = pSelect->pEList->nExpr;
          if (local_188 == (Trigger *)0x0) {
            pVVar27 = sqlite3GetVdbe(pParse);
            iVar19 = pVVar27->nOp;
            if (pTab->nModuleArg == 0) {
              pVVar30 = (VTable *)0x0;
            }
            else {
              pVVar30 = sqlite3GetVTable(pParse->db,pTab);
            }
            iVar39 = (int)local_190;
            for (iVar21 = 1; iVar21 < iVar19; iVar21 = iVar21 + 1) {
              pVVar28 = sqlite3VdbeGetOp(pVVar27,iVar21);
              if (pVVar28->opcode == 0xa3) {
                if ((VTable *)(pVVar28->p4).p == pVVar30) goto LAB_0015e2e1;
              }
              else if ((pVVar28->opcode == 'l') && (pVVar28->p3 == iVar39)) {
                iVar22 = pTab->tnum;
                ppIVar26 = &pTab->pIndex;
                while( true ) {
                  if (pVVar28->p2 == iVar22) goto LAB_0015e2e1;
                  pIVar9 = *ppIVar26;
                  if (pIVar9 == (Index *)0x0) break;
                  ppIVar26 = &pIVar9->pNext;
                  iVar22 = pIVar9->tnum;
                }
              }
            }
            bVar2 = 0;
            iVar19 = 0;
          }
          else {
LAB_0015e2e1:
            iVar19 = pParse->nTab;
            pParse->nTab = iVar19 + 1;
            iVar21 = sqlite3GetTempReg(pParse);
            iVar39 = sqlite3GetTempReg(pParse);
            sqlite3VdbeAddOp2(p,0x71,iVar19,p2);
            iVar22 = sqlite3VdbeAddOp1(p,0xe,local_118.iSDParm);
            sqlite3VdbeAddOp3(p,0x5c,(int)local_170,p2,iVar21);
            sqlite3VdbeAddOp2(p,0x79,iVar19,iVar39);
            sqlite3VdbeAddOp3(p,0x7a,iVar19,iVar21,iVar39);
            sqlite3VdbeGoto(p,iVar22);
            sqlite3VdbeJumpHere(p,iVar22);
            if (iVar21 != 0) {
              bVar2 = pParse->nTempReg;
              if ((ulong)bVar2 < 8) {
                pParse->nTempReg = bVar2 + 1;
                pParse->aTempReg[bVar2] = iVar21;
              }
            }
            bVar2 = 1;
            if (iVar39 != 0) {
              bVar3 = pParse->nTempReg;
              bVar2 = 1;
              if ((ulong)bVar3 < 8) {
                pParse->nTempReg = bVar3 + 1;
                pParse->aTempReg[bVar3] = iVar39;
              }
            }
          }
        }
        if ((pColumn == (IdList *)0x0) && (0 < (int)p2)) {
          local_220 = (undefined1 *)(ulong)(uint)(int)pTab->iPKey;
        }
        uVar42 = (uint)pTab->nCol;
        lVar47 = 0;
        uVar40 = 0;
        if (0 < (int)uVar42) {
          uVar40 = (ulong)uVar42;
        }
        iVar21 = 0;
        for (; uVar40 * 0x20 != lVar47; lVar47 = lVar47 + 0x20) {
          iVar21 = iVar21 + (uint)(((&pTab->aCol->colFlags)[lVar47] >> 1 & 1) != 0);
        }
        if ((pColumn == (IdList *)0x0) && (p2 != 0)) {
          if (p2 != uVar42 - iVar21) {
            local_1c8 = (int *)0x0;
            sqlite3ErrorMsg(pParse,"table %S has %d columns but %d values were supplied",pTabList,0,
                            (ulong)(uVar42 - iVar21),(ulong)p2);
            goto LAB_0015da53;
          }
        }
        else if ((pColumn != (IdList *)0x0) && (p2 != pColumn->nId)) {
          local_1c8 = (int *)0x0;
          sqlite3ErrorMsg(pParse,"%d values for %d columns",(ulong)p2);
          goto LAB_0015da53;
        }
        local_140 = 1;
        uVar40 = 0;
        if ((((db->flags & 0x80) != 0) && (pParse->nested == '\0')) &&
           (pParse->pTriggerTab == (Table *)0x0)) {
          uVar42 = pParse->nMem + 1;
          uVar40 = (ulong)uVar42;
          pParse->nMem = uVar42;
          sqlite3VdbeAddOp2(p,0x46,0,uVar42);
        }
        local_160 = uVar40;
        if (local_138 == (Select *)0x0) {
          uVar40 = 0;
          uVar42 = sqlite3OpenTableAndIndices(pParse,pTab,0x6d,'\0',-1,(u8 *)0x0,&iDataCur,&iIdxCur)
          ;
          local_1c8 = (int *)sqlite3DbMallocRawNN(db,(long)(int)uVar42 * 4 + 4);
          if (local_1c8 == (int *)0x0) {
            local_1c8 = (int *)0x0;
            goto LAB_0015da53;
          }
          ppIVar26 = &pTab->pIndex;
          uVar45 = (ulong)uVar42;
          if ((int)uVar42 < 1) {
            uVar45 = uVar40;
          }
          for (; uVar45 != uVar40; uVar40 = uVar40 + 1) {
            pIVar9 = *ppIVar26;
            iVar21 = pParse->nMem + 1;
            pParse->nMem = iVar21;
            local_1c8[uVar40] = iVar21;
            pParse->nMem = pParse->nMem + (uint)pIVar9->nColumn;
            ppIVar26 = &pIVar9->pNext;
          }
        }
        else {
          local_1c8 = (int *)0x0;
        }
        iVar21 = (int)local_160;
        if (pUpsert != (Upsert *)0x0) {
          if (pTab->nModuleArg != 0) {
            sqlite3ErrorMsg(pParse,"UPSERT not implemented for virtual table \"%s\"",pTab->zName);
            goto LAB_0015da53;
          }
          pTabList->a[0].iCursor = iDataCur;
          pUpsert->pUpsertSrc = pTabList;
          pUpsert->regData = uVar34;
          pUpsert->iDataCur = iDataCur;
          pUpsert->iIdxCur = iIdxCur;
          if (pUpsert->pUpsertTarget != (ExprList *)0x0) {
            local_68.pWinSelect = (Select *)0x0;
            local_68.uNC.pEList = (ExprList *)0x0;
            local_68.pNext = (NameContext *)0x0;
            local_68.nRef = 0;
            local_68.nErr = 0;
            local_68.ncFlags = 0;
            local_68._42_6_ = 0;
            local_68.pParse = pParse;
            local_68.pSrcList = pTabList;
            iVar21 = sqlite3ResolveExprListNames(&local_68,pUpsert->pUpsertTarget);
            if ((iVar21 == 0) &&
               (iVar21 = sqlite3ResolveExprNames(&local_68,pUpsert->pUpsertTargetWhere), iVar21 == 0
               )) {
              pTVar29 = pTabList->a[0].pTab;
              pEVar7 = pUpsert->pUpsertTarget;
              local_198 = (ExprList_item *)CONCAT44(local_198._4_4_,pTabList->a[0].iCursor);
              if ((((pTVar29->tabFlags & 0x20) != 0) ||
                  ((pEVar7->nExpr != 1 || (pEVar8 = pEVar7->a[0].pExpr, pEVar8->op != 0xa2)))) ||
                 (pEVar8->iColumn != -1)) {
                memset(&isReplace,0,0x90);
                _isReplace = (Parse *)CONCAT71(stack0xffffffffffffff09,0x6a);
                aStack_e8.pEList = (ExprList *)local_b0;
                local_b0[0] = 0xa2;
                local_84 = (int)local_198;
                ppIVar26 = &pTVar29->pIndex;
                while (pIVar9 = *ppIVar26, pIVar9 != (Index *)0x0) {
                  if ((pIVar9->onError != '\0') &&
                     (uVar42 = pEVar7->nExpr, uVar42 == pIVar9->nKeyCol)) {
                    if (pIVar9->pPartIdxWhere == (Expr *)0x0) {
LAB_0015e54d:
                      local_190 = (ulong)uVar42;
                      lVar47 = local_190 * 0x20;
                      for (uVar40 = 0; uVar40 != local_190; uVar40 = uVar40 + 1) {
                        local_f0 = (SrcList *)pIVar9->azColl[uVar40];
                        if (pIVar9->aiColumn[uVar40] == -2) {
                          pB = (anon_union_8_3_1bb8468b_for_uNC)
                               ((anon_union_8_3_1bb8468b_for_uNC *)(pIVar9->aColExpr->a + uVar40))->
                               pAggInfo;
                          if ((pB.pAggInfo)->directMode != 'j') goto LAB_0015e5c7;
                        }
                        else {
                          pB.pEList = (ExprList *)local_b0;
                          local_80 = pIVar9->aiColumn[uVar40];
LAB_0015e5c7:
                          aStack_e8 = pB;
                          pB.pEList = (ExprList *)&isReplace;
                        }
                        lVar37 = 0;
                        do {
                          if (lVar47 + 0x20 == lVar37 + 0x20) goto LAB_0015e543;
                          uVar42 = sqlite3ExprCompare(pParse,*(Expr **)((long)&pEVar7->a[0].pExpr +
                                                                       lVar37),(Expr *)pB.pEList,
                                                      (int)local_198);
                          lVar37 = lVar37 + 0x20;
                        } while (1 < uVar42);
                      }
                      pUpsert->pUpsertIdx = pIVar9;
                      goto LAB_0015e960;
                    }
                    if (pUpsert->pUpsertTargetWhere != (Expr *)0x0) {
                      iVar21 = sqlite3ExprCompare(pParse,pUpsert->pUpsertTargetWhere,
                                                  pIVar9->pPartIdxWhere,(int)local_198);
                      if (iVar21 == 0) {
                        uVar42 = (uint)pIVar9->nKeyCol;
                        goto LAB_0015e54d;
                      }
                    }
                  }
LAB_0015e543:
                  ppIVar26 = &pIVar9->pNext;
                }
                sqlite3ErrorMsg(pParse,
                                "ON CONFLICT clause does not match any PRIMARY KEY or UNIQUE constraint"
                               );
              }
            }
LAB_0015e960:
            iVar21 = (int)local_160;
          }
        }
        if (bVar2 == 0) {
          if (pSelect == (Select *)0x0) {
            local_17c = 0;
            local_178 = 0;
          }
          else {
            local_17c = sqlite3VdbeAddOp1(p,0xe,local_118.iSDParm);
            local_178 = local_17c;
          }
        }
        else {
          local_178 = sqlite3VdbeAddOp1(p,0x24,iVar19);
          local_17c = p->nOp;
        }
        uVar42 = pParse->nLabel - 1;
        uVar40 = (ulong)uVar42;
        pParse->nLabel = uVar42;
        local_130 = (ulong)local_220 & 0xffffffff;
        pTVar24 = local_188;
        pSVar48 = local_138;
        if ((tmask & 1U) != 0) {
          local_168 = uVar40;
          uVar42 = sqlite3GetTempRange(pParse,pTab->nCol + 1);
          if ((int)local_220 < 0) {
            sqlite3VdbeAddOp2(p,0x46,-1,uVar42);
          }
          else {
            if (bVar2 == 0) {
              sqlite3ExprCode(pParse,pList->a[local_130].pExpr,uVar42);
            }
            else {
              sqlite3VdbeAddOp3(p,0x5a,iVar19,(int)local_220,uVar42);
            }
            iVar21 = sqlite3VdbeAddOp1(p,0x33,uVar42);
            sqlite3VdbeAddOp2(p,0x46,-1,uVar42);
            sqlite3VdbeJumpHere(p,iVar21);
            sqlite3VdbeAddOp1(p,0xf,uVar42);
          }
          local_198 = (ExprList_item *)CONCAT44(local_198._4_4_,(uint)(pColumn == (IdList *)0x0));
          local_190 = CONCAT71(local_190._1_7_,pList != (ExprList *)0x0 | bVar2);
          iVar21 = uVar42 + 1;
          local_120 = pList->a;
          iVar39 = 0;
          local_128 = (ulong)uVar42;
          for (uVar40 = 0; pSVar48 = local_138, uVar17 = pTab->nCol,
              (long)uVar40 < (long)(short)uVar17; uVar40 = uVar40 + 1) {
            iVar22 = (int)uVar40;
            if (pColumn == (IdList *)0x0) {
              if ((byte)local_190 == 0) goto LAB_0015eb90;
LAB_0015ebc7:
              if (bVar2 == 0) {
                pEVar8 = local_120[iVar39].pExpr;
                local_158 = pParse->pVdbe;
                sqlite3ExprCode(pParse,pEVar8,iVar21 + iVar22);
                iVar35 = pParse->nMem + 1;
                pParse->nMem = iVar35;
                sqlite3VdbeAddOp2(local_158,0x4e,iVar21 + iVar22,iVar35);
                pEVar8->op2 = pEVar8->op;
                pEVar8->op = 0xa8;
                pEVar8->iTable = iVar35;
                pbVar1 = (byte *)((long)&pEVar8->flags + 1);
                *pbVar1 = *pbVar1 & 0xef;
              }
              else {
                sqlite3VdbeAddOp3(p,0x5a,iVar19,iVar39,iVar21 + iVar22);
              }
            }
            else {
              uVar42 = pColumn->nId;
              uVar45 = 0;
              if (0 < (int)uVar42) {
                uVar45 = (ulong)uVar42;
              }
              lVar47 = 8;
              for (uVar38 = 0; uVar45 != uVar38; uVar38 = uVar38 + 1) {
                if (uVar40 == *(uint *)((long)&pColumn->a->zName + lVar47)) {
                  uVar45 = uVar38 & 0xffffffff;
                  break;
                }
                lVar47 = lVar47 + 0x10;
              }
              iVar39 = (int)uVar45;
              if (((byte)local_190 & iVar39 < (int)uVar42) != 0) goto LAB_0015ebc7;
LAB_0015eb90:
              sqlite3ExprCode(pParse,pTab->aCol[uVar40].pDflt,iVar21 + iVar22);
            }
            iVar39 = iVar39 + (int)local_198;
          }
          if (local_138 == (Select *)0x0) {
            sqlite3TableAffinity(p,pTab,iVar21);
            uVar17 = pTab->nCol;
          }
          uVar40 = local_168;
          pTVar24 = local_188;
          sqlite3CodeRowTrigger
                    (pParse,local_188,0x78,(ExprList *)0x0,1,pTab,
                     (int)local_128 + (int)(short)~uVar17,(int)local_150,(int)local_168);
          sqlite3ReleaseTempRange(pParse,(int)local_128,pTab->nCol + 1);
          iVar21 = (int)local_160;
        }
        if (pSVar48 == (Select *)0x0) {
          local_168 = uVar40;
          if (pTab->nModuleArg != 0) {
            sqlite3VdbeAddOp2(p,0x49,0,iVar18);
          }
          if ((int)local_220 < 0) {
            if ((pTab->nModuleArg == 0) && ((bVar46 & 1) == 0)) {
LAB_0015ed76:
              sqlite3VdbeAddOp3(p,0x79,iDataCur,iVar23,iVar20);
            }
            else {
              local_140 = 0;
              sqlite3VdbeAddOp2(p,0x49,0,iVar23);
            }
          }
          else {
            if (bVar2 == 0) {
              if (pSelect == (Select *)0x0) {
                pEVar8 = pList->a[local_130].pExpr;
                if ((pEVar8->op == 'r') && (pTab->nModuleArg == 0)) goto LAB_0015ed76;
                sqlite3ExprCode(pParse,pEVar8,iVar23);
              }
              else {
                sqlite3VdbeAddOp2(p,0x4e,(int)local_220 + (int)local_170,iVar23);
              }
            }
            else {
              sqlite3VdbeAddOp3(p,0x5a,iVar19,(int)local_220,iVar23);
            }
            if (pTab->nModuleArg == 0) {
              iVar21 = sqlite3VdbeAddOp1(p,0x33,iVar23);
              sqlite3VdbeAddOp3(p,0x79,iDataCur,iVar23,iVar20);
              sqlite3VdbeJumpHere(p,iVar21);
            }
            else {
              sqlite3VdbeAddOp2(p,0x32,iVar23,p->nOp + 2);
            }
            sqlite3VdbeAddOp1(p,0xf,iVar23);
            local_140 = 0;
          }
          autoIncStep(pParse,iVar20,iVar23);
          local_198 = pList->a;
          iVar21 = 0;
          for (uVar40 = 0; (long)uVar40 < (long)pTab->nCol; uVar40 = uVar40 + 1) {
            iVar20 = (int)uVar40 + uVar34;
            if (uVar40 == (uint)(int)pTab->iPKey) {
              sqlite3VdbeAddOp1(p,0x4a,iVar20);
            }
            else {
              if (pColumn == (IdList *)0x0) {
                if ((pTab->aCol[uVar40].colFlags & 2) == 0) {
                  uVar42 = (int)uVar40 - iVar21;
                  if ((-1 < (int)uVar42) && (p2 != 0)) goto LAB_0015efb2;
                }
                else {
                  iVar21 = iVar21 + 1;
                }
              }
              else {
                uVar5 = pColumn->nId;
                uVar45 = 0;
                if (0 < (int)uVar5) {
                  uVar45 = (ulong)uVar5;
                }
                lVar47 = 8;
                for (uVar38 = 0; uVar45 != uVar38; uVar38 = uVar38 + 1) {
                  if (uVar40 == *(uint *)((long)&pColumn->a->zName + lVar47)) {
                    uVar45 = uVar38 & 0xffffffff;
                    break;
                  }
                  lVar47 = lVar47 + 0x10;
                }
                uVar42 = (uint)uVar45;
                if ((int)uVar42 < (int)uVar5 && p2 != 0) {
LAB_0015efb2:
                  if (bVar2 == 0) {
                    if (pSelect == (Select *)0x0) {
                      sqlite3ExprCode(pParse,(Expr *)local_198[uVar42].pExpr,iVar20);
                    }
                    else if ((uint)local_170 != uVar34) {
                      sqlite3VdbeAddOp2(p,0x4f,uVar42 + (uint)local_170,iVar20);
                    }
                  }
                  else {
                    sqlite3VdbeAddOp3(p,0x5a,iVar19,uVar42,iVar20);
                  }
                  goto LAB_0015f014;
                }
              }
              sqlite3ExprCodeFactorable(pParse,pTab->aCol[uVar40].pDflt,iVar20);
            }
LAB_0015f014:
          }
          if (pTab->nModuleArg == 0) {
            sqlite3GenerateConstraintChecks
                      (pParse,pTab,local_1c8,iDataCur,iIdxCur,iVar18,0,
                       (byte)~(byte)((ulong)local_220 >> 0x18) >> 7,(u8)local_150,(int)local_168,
                       &isReplace,(int *)0x0,pUpsert);
            uVar34 = 0;
            sqlite3FkCheck(pParse,pTab,0,iVar18,(int *)0x0,0);
            if (isReplace == 0) {
              uVar34 = 1;
            }
            else if ((local_188 == (Trigger *)0x0) && (uVar34 = 1, (db->flags & 0x4000) != 0)) {
              pFVar32 = sqlite3FkReferences(pTab);
              uVar34 = (uint)(pFVar32 == (FKey *)0x0);
            }
            sqlite3CompleteInsertion
                      (pParse,pTab,iDataCur,iIdxCur,iVar18,local_1c8,0,(int)local_140,uVar34);
          }
          else {
            pVVar30 = sqlite3GetVTable(db,pTab);
            sqlite3VtabMakeWritable(pParse,pTab);
            sqlite3VdbeAddOp4(p,10,1,pTab->nCol + 2,iVar18,(char *)pVVar30,-0xc);
            if (0 < (long)p->nOp) {
              uVar43 = 2;
              if ((int)local_150 != 0xb) {
                uVar43 = local_150;
              }
              p->aOp[(long)p->nOp + -1].p5 = (u16)uVar43;
            }
            pPVar31 = pParse->pToplevel;
            if (pParse->pToplevel == (Parse *)0x0) {
              pPVar31 = pParse;
            }
            pPVar31->mayAbort = '\x01';
          }
          iVar21 = (int)local_160;
          uVar40 = local_168;
          pTVar24 = local_188;
        }
        if (iVar21 != 0) {
          sqlite3VdbeAddOp2(p,0x53,iVar21,1);
        }
        if (pTVar24 != (Trigger *)0x0) {
          sqlite3CodeRowTrigger
                    (pParse,pTVar24,0x78,(ExprList *)0x0,2,pTab,iVar23 + ~(int)pTab->nCol,
                     (int)local_150,(int)uVar40);
        }
        sqlite3VdbeResolveLabel(p,(int)uVar40);
        if (bVar2 == 0) {
          if (pSelect != (Select *)0x0) {
            sqlite3VdbeGoto(p,local_17c);
            sqlite3VdbeJumpHere(p,local_178);
          }
        }
        else {
          sqlite3VdbeAddOp2(p,5,iVar19,local_17c);
          sqlite3VdbeJumpHere(p,local_178);
          sqlite3VdbeAddOp1(p,0x75,iVar19);
        }
      }
      if ((pParse->nested == '\0') && (pParse->pTriggerTab == (Table *)0x0)) {
        sqlite3AutoincrementEnd(pParse);
      }
      if (iVar21 != 0) {
        sqlite3VdbeAddOp2(p,0x51,iVar21,1);
        sqlite3VdbeSetNumCols(p,1);
        sqlite3VdbeSetColName(p,0,0,"rows inserted",(_func_void_void_ptr *)0x0);
      }
      goto LAB_0015da53;
    }
  }
  local_1c8 = (int *)0x0;
LAB_0015da53:
  sqlite3SrcListDelete(db,pTabList);
  sqlite3ExprListDelete(db,pList);
  sqlite3UpsertDelete(db,pUpsert);
  sqlite3SelectDelete(db,pSelect);
  sqlite3IdListDelete(db,pColumn);
  sqlite3DbFree(db,local_1c8);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Insert(
  Parse *pParse,        /* Parser context */
  SrcList *pTabList,    /* Name of table into which we are inserting */
  Select *pSelect,      /* A SELECT statement to use as the data source */
  IdList *pColumn,      /* Column names corresponding to IDLIST. */
  int onError,          /* How to handle constraint errors */
  Upsert *pUpsert       /* ON CONFLICT clauses for upsert, or NULL */
){
  sqlite3 *db;          /* The main database structure */
  Table *pTab;          /* The table to insert into.  aka TABLE */
  int i, j;             /* Loop counters */
  Vdbe *v;              /* Generate code into this virtual machine */
  Index *pIdx;          /* For looping over indices of the table */
  int nColumn;          /* Number of columns in the data */
  int nHidden = 0;      /* Number of hidden columns if TABLE is virtual */
  int iDataCur = 0;     /* VDBE cursor that is the main data repository */
  int iIdxCur = 0;      /* First index cursor */
  int ipkColumn = -1;   /* Column that is the INTEGER PRIMARY KEY */
  int endOfLoop;        /* Label for the end of the insertion loop */
  int srcTab = 0;       /* Data comes from this temporary cursor if >=0 */
  int addrInsTop = 0;   /* Jump to label "D" */
  int addrCont = 0;     /* Top of insert loop. Label "C" in templates 3 and 4 */
  SelectDest dest;      /* Destination for SELECT on rhs of INSERT */
  int iDb;              /* Index of database holding TABLE */
  u8 useTempTable = 0;  /* Store SELECT results in intermediate table */
  u8 appendFlag = 0;    /* True if the insert is likely to be an append */
  u8 withoutRowid;      /* 0 for normal table.  1 for WITHOUT ROWID table */
  u8 bIdListInOrder;    /* True if IDLIST is in table order */
  ExprList *pList = 0;  /* List of VALUES() to be inserted  */

  /* Register allocations */
  int regFromSelect = 0;/* Base register for data coming from SELECT */
  int regAutoinc = 0;   /* Register holding the AUTOINCREMENT counter */
  int regRowCount = 0;  /* Memory cell used for the row counter */
  int regIns;           /* Block of regs holding rowid+data being inserted */
  int regRowid;         /* registers holding insert rowid */
  int regData;          /* register holding first column to insert */
  int *aRegIdx = 0;     /* One register allocated to each index */

#ifndef SQLITE_OMIT_TRIGGER
  int isView;                 /* True if attempting to insert into a view */
  Trigger *pTrigger;          /* List of triggers on pTab, if required */
  int tmask;                  /* Mask of trigger times */
#endif

  db = pParse->db;
  if( pParse->nErr || db->mallocFailed ){
    goto insert_cleanup;
  }
  dest.iSDParm = 0;  /* Suppress a harmless compiler warning */

  /* If the Select object is really just a simple VALUES() list with a
  ** single row (the common case) then keep that one row of values
  ** and discard the other (unused) parts of the pSelect object
  */
  if( pSelect && (pSelect->selFlags & SF_Values)!=0 && pSelect->pPrior==0 ){
    pList = pSelect->pEList;
    pSelect->pEList = 0;
    sqlite3SelectDelete(db, pSelect);
    pSelect = 0;
  }

  /* Locate the table into which we will be inserting new information.
  */
  assert( pTabList->nSrc==1 );
  pTab = sqlite3SrcListLookup(pParse, pTabList);
  if( pTab==0 ){
    goto insert_cleanup;
  }
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb<db->nDb );
  if( sqlite3AuthCheck(pParse, SQLITE_INSERT, pTab->zName, 0,
                       db->aDb[iDb].zDbSName) ){
    goto insert_cleanup;
  }
  withoutRowid = !HasRowid(pTab);

  /* Figure out if we have any triggers and if the table being
  ** inserted into is a view
  */
#ifndef SQLITE_OMIT_TRIGGER
  pTrigger = sqlite3TriggersExist(pParse, pTab, TK_INSERT, 0, &tmask);
  isView = pTab->pSelect!=0;
#else
# define pTrigger 0
# define tmask 0
# define isView 0
#endif
#ifdef SQLITE_OMIT_VIEW
# undef isView
# define isView 0
#endif
  assert( (pTrigger && tmask) || (pTrigger==0 && tmask==0) );

  /* If pTab is really a view, make sure it has been initialized.
  ** ViewGetColumnNames() is a no-op if pTab is not a view.
  */
  if( sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto insert_cleanup;
  }

  /* Cannot insert into a read-only table.
  */
  if( sqlite3IsReadOnly(pParse, pTab, tmask) ){
    goto insert_cleanup;
  }

  /* Allocate a VDBE
  */
  v = sqlite3GetVdbe(pParse);
  if( v==0 ) goto insert_cleanup;
  if( pParse->nested==0 ) sqlite3VdbeCountChanges(v);
  sqlite3BeginWriteOperation(pParse, pSelect || pTrigger, iDb);

#ifndef SQLITE_OMIT_XFER_OPT
  /* If the statement is of the form
  **
  **       INSERT INTO <table1> SELECT * FROM <table2>;
  **
  ** Then special optimizations can be applied that make the transfer
  ** very fast and which reduce fragmentation of indices.
  **
  ** This is the 2nd template.
  */
  if( pColumn==0 && xferOptimization(pParse, pTab, pSelect, onError, iDb) ){
    assert( !pTrigger );
    assert( pList==0 );
    goto insert_end;
  }
#endif /* SQLITE_OMIT_XFER_OPT */

  /* If this is an AUTOINCREMENT table, look up the sequence number in the
  ** sqlite_sequence table and store it in memory cell regAutoinc.
  */
  regAutoinc = autoIncBegin(pParse, iDb, pTab);

  /* Allocate registers for holding the rowid of the new row,
  ** the content of the new row, and the assembled row record.
  */
  regRowid = regIns = pParse->nMem+1;
  pParse->nMem += pTab->nCol + 1;
  if( IsVirtual(pTab) ){
    regRowid++;
    pParse->nMem++;
  }
  regData = regRowid+1;

  /* If the INSERT statement included an IDLIST term, then make sure
  ** all elements of the IDLIST really are columns of the table and 
  ** remember the column indices.
  **
  ** If the table has an INTEGER PRIMARY KEY column and that column
  ** is named in the IDLIST, then record in the ipkColumn variable
  ** the index into IDLIST of the primary key column.  ipkColumn is
  ** the index of the primary key as it appears in IDLIST, not as
  ** is appears in the original table.  (The index of the INTEGER
  ** PRIMARY KEY in the original table is pTab->iPKey.)
  */
  bIdListInOrder = (pTab->tabFlags & TF_OOOHidden)==0;
  if( pColumn ){
    for(i=0; i<pColumn->nId; i++){
      pColumn->a[i].idx = -1;
    }
    for(i=0; i<pColumn->nId; i++){
      for(j=0; j<pTab->nCol; j++){
        if( sqlite3StrICmp(pColumn->a[i].zName, pTab->aCol[j].zName)==0 ){
          pColumn->a[i].idx = j;
          if( i!=j ) bIdListInOrder = 0;
          if( j==pTab->iPKey ){
            ipkColumn = i;  assert( !withoutRowid );
          }
          break;
        }
      }
      if( j>=pTab->nCol ){
        if( sqlite3IsRowid(pColumn->a[i].zName) && !withoutRowid ){
          ipkColumn = i;
          bIdListInOrder = 0;
        }else{
          sqlite3ErrorMsg(pParse, "table %S has no column named %s",
              pTabList, 0, pColumn->a[i].zName);
          pParse->checkSchema = 1;
          goto insert_cleanup;
        }
      }
    }
  }

  /* Figure out how many columns of data are supplied.  If the data
  ** is coming from a SELECT statement, then generate a co-routine that
  ** produces a single row of the SELECT on each invocation.  The
  ** co-routine is the common header to the 3rd and 4th templates.
  */
  if( pSelect ){
    /* Data is coming from a SELECT or from a multi-row VALUES clause.
    ** Generate a co-routine to run the SELECT. */
    int regYield;       /* Register holding co-routine entry-point */
    int addrTop;        /* Top of the co-routine */
    int rc;             /* Result code */

    regYield = ++pParse->nMem;
    addrTop = sqlite3VdbeCurrentAddr(v) + 1;
    sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, addrTop);
    sqlite3SelectDestInit(&dest, SRT_Coroutine, regYield);
    dest.iSdst = bIdListInOrder ? regData : 0;
    dest.nSdst = pTab->nCol;
    rc = sqlite3Select(pParse, pSelect, &dest);
    regFromSelect = dest.iSdst;
    if( rc || db->mallocFailed || pParse->nErr ) goto insert_cleanup;
    sqlite3VdbeEndCoroutine(v, regYield);
    sqlite3VdbeJumpHere(v, addrTop - 1);                       /* label B: */
    assert( pSelect->pEList );
    nColumn = pSelect->pEList->nExpr;

    /* Set useTempTable to TRUE if the result of the SELECT statement
    ** should be written into a temporary table (template 4).  Set to
    ** FALSE if each output row of the SELECT can be written directly into
    ** the destination table (template 3).
    **
    ** A temp table must be used if the table being updated is also one
    ** of the tables being read by the SELECT statement.  Also use a 
    ** temp table in the case of row triggers.
    */
    if( pTrigger || readsTable(pParse, iDb, pTab) ){
      useTempTable = 1;
    }

    if( useTempTable ){
      /* Invoke the coroutine to extract information from the SELECT
      ** and add it to a transient table srcTab.  The code generated
      ** here is from the 4th template:
      **
      **      B: open temp table
      **      L: yield X, goto M at EOF
      **         insert row from R..R+n into temp table
      **         goto L
      **      M: ...
      */
      int regRec;          /* Register to hold packed record */
      int regTempRowid;    /* Register to hold temp table ROWID */
      int addrL;           /* Label "L" */

      srcTab = pParse->nTab++;
      regRec = sqlite3GetTempReg(pParse);
      regTempRowid = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(v, OP_OpenEphemeral, srcTab, nColumn);
      addrL = sqlite3VdbeAddOp1(v, OP_Yield, dest.iSDParm); VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regFromSelect, nColumn, regRec);
      sqlite3VdbeAddOp2(v, OP_NewRowid, srcTab, regTempRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, srcTab, regRec, regTempRowid);
      sqlite3VdbeGoto(v, addrL);
      sqlite3VdbeJumpHere(v, addrL);
      sqlite3ReleaseTempReg(pParse, regRec);
      sqlite3ReleaseTempReg(pParse, regTempRowid);
    }
  }else{
    /* This is the case if the data for the INSERT is coming from a 
    ** single-row VALUES clause
    */
    NameContext sNC;
    memset(&sNC, 0, sizeof(sNC));
    sNC.pParse = pParse;
    srcTab = -1;
    assert( useTempTable==0 );
    if( pList ){
      nColumn = pList->nExpr;
      if( sqlite3ResolveExprListNames(&sNC, pList) ){
        goto insert_cleanup;
      }
    }else{
      nColumn = 0;
    }
  }

  /* If there is no IDLIST term but the table has an integer primary
  ** key, the set the ipkColumn variable to the integer primary key 
  ** column index in the original table definition.
  */
  if( pColumn==0 && nColumn>0 ){
    ipkColumn = pTab->iPKey;
  }

  /* Make sure the number of columns in the source data matches the number
  ** of columns to be inserted into the table.
  */
  for(i=0; i<pTab->nCol; i++){
    nHidden += (IsHiddenColumn(&pTab->aCol[i]) ? 1 : 0);
  }
  if( pColumn==0 && nColumn && nColumn!=(pTab->nCol-nHidden) ){
    sqlite3ErrorMsg(pParse, 
       "table %S has %d columns but %d values were supplied",
       pTabList, 0, pTab->nCol-nHidden, nColumn);
    goto insert_cleanup;
  }
  if( pColumn!=0 && nColumn!=pColumn->nId ){
    sqlite3ErrorMsg(pParse, "%d values for %d columns", nColumn, pColumn->nId);
    goto insert_cleanup;
  }
    
  /* Initialize the count of rows to be inserted
  */
  if( (db->flags & SQLITE_CountRows)!=0
   && !pParse->nested
   && !pParse->pTriggerTab
  ){
    regRowCount = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Integer, 0, regRowCount);
  }

  /* If this is not a view, open the table and and all indices */
  if( !isView ){
    int nIdx;
    nIdx = sqlite3OpenTableAndIndices(pParse, pTab, OP_OpenWrite, 0, -1, 0,
                                      &iDataCur, &iIdxCur);
    aRegIdx = sqlite3DbMallocRawNN(db, sizeof(int)*(nIdx+1));
    if( aRegIdx==0 ){
      goto insert_cleanup;
    }
    for(i=0, pIdx=pTab->pIndex; i<nIdx; pIdx=pIdx->pNext, i++){
      assert( pIdx );
      aRegIdx[i] = ++pParse->nMem;
      pParse->nMem += pIdx->nColumn;
    }
  }
#ifndef SQLITE_OMIT_UPSERT
  if( pUpsert ){
    if( IsVirtual(pTab) ){
      sqlite3ErrorMsg(pParse, "UPSERT not implemented for virtual table \"%s\"",
              pTab->zName);
      goto insert_cleanup;
    }
    pTabList->a[0].iCursor = iDataCur;
    pUpsert->pUpsertSrc = pTabList;
    pUpsert->regData = regData;
    pUpsert->iDataCur = iDataCur;
    pUpsert->iIdxCur = iIdxCur;
    if( pUpsert->pUpsertTarget ){
      sqlite3UpsertAnalyzeTarget(pParse, pTabList, pUpsert);
    }
  }
#endif


  /* This is the top of the main insertion loop */
  if( useTempTable ){
    /* This block codes the top of loop only.  The complete loop is the
    ** following pseudocode (template 4):
    **
    **         rewind temp table, if empty goto D
    **      C: loop over rows of intermediate table
    **           transfer values form intermediate table into <table>
    **         end loop
    **      D: ...
    */
    addrInsTop = sqlite3VdbeAddOp1(v, OP_Rewind, srcTab); VdbeCoverage(v);
    addrCont = sqlite3VdbeCurrentAddr(v);
  }else if( pSelect ){
    /* This block codes the top of loop only.  The complete loop is the
    ** following pseudocode (template 3):
    **
    **      C: yield X, at EOF goto D
    **         insert the select result into <table> from R..R+n
    **         goto C
    **      D: ...
    */
    addrInsTop = addrCont = sqlite3VdbeAddOp1(v, OP_Yield, dest.iSDParm);
    VdbeCoverage(v);
  }

  /* Run the BEFORE and INSTEAD OF triggers, if there are any
  */
  endOfLoop = sqlite3VdbeMakeLabel(pParse);
  if( tmask & TRIGGER_BEFORE ){
    int regCols = sqlite3GetTempRange(pParse, pTab->nCol+1);

    /* build the NEW.* reference row.  Note that if there is an INTEGER
    ** PRIMARY KEY into which a NULL is being inserted, that NULL will be
    ** translated into a unique ID for the row.  But on a BEFORE trigger,
    ** we do not know what the unique ID will be (because the insert has
    ** not happened yet) so we substitute a rowid of -1
    */
    if( ipkColumn<0 ){
      sqlite3VdbeAddOp2(v, OP_Integer, -1, regCols);
    }else{
      int addr1;
      assert( !withoutRowid );
      if( useTempTable ){
        sqlite3VdbeAddOp3(v, OP_Column, srcTab, ipkColumn, regCols);
      }else{
        assert( pSelect==0 );  /* Otherwise useTempTable is true */
        sqlite3ExprCode(pParse, pList->a[ipkColumn].pExpr, regCols);
      }
      addr1 = sqlite3VdbeAddOp1(v, OP_NotNull, regCols); VdbeCoverage(v);
      sqlite3VdbeAddOp2(v, OP_Integer, -1, regCols);
      sqlite3VdbeJumpHere(v, addr1);
      sqlite3VdbeAddOp1(v, OP_MustBeInt, regCols); VdbeCoverage(v);
    }

    /* Cannot have triggers on a virtual table. If it were possible,
    ** this block would have to account for hidden column.
    */
    assert( !IsVirtual(pTab) );

    /* Create the new column data
    */
    for(i=j=0; i<pTab->nCol; i++){
      if( pColumn ){
        for(j=0; j<pColumn->nId; j++){
          if( pColumn->a[j].idx==i ) break;
        }
      }
      if( (!useTempTable && !pList) || (pColumn && j>=pColumn->nId)
            || (pColumn==0 && IsOrdinaryHiddenColumn(&pTab->aCol[i])) ){
        sqlite3ExprCode(pParse, pTab->aCol[i].pDflt, regCols+i+1);
      }else if( useTempTable ){
        sqlite3VdbeAddOp3(v, OP_Column, srcTab, j, regCols+i+1); 
      }else{
        assert( pSelect==0 ); /* Otherwise useTempTable is true */
        sqlite3ExprCodeAndCache(pParse, pList->a[j].pExpr, regCols+i+1);
      }
      if( pColumn==0 && !IsOrdinaryHiddenColumn(&pTab->aCol[i]) ) j++;
    }

    /* If this is an INSERT on a view with an INSTEAD OF INSERT trigger,
    ** do not attempt any conversions before assembling the record.
    ** If this is a real table, attempt conversions as required by the
    ** table column affinities.
    */
    if( !isView ){
      sqlite3TableAffinity(v, pTab, regCols+1);
    }

    /* Fire BEFORE or INSTEAD OF triggers */
    sqlite3CodeRowTrigger(pParse, pTrigger, TK_INSERT, 0, TRIGGER_BEFORE, 
        pTab, regCols-pTab->nCol-1, onError, endOfLoop);

    sqlite3ReleaseTempRange(pParse, regCols, pTab->nCol+1);
  }

  /* Compute the content of the next row to insert into a range of
  ** registers beginning at regIns.
  */
  if( !isView ){
    if( IsVirtual(pTab) ){
      /* The row that the VUpdate opcode will delete: none */
      sqlite3VdbeAddOp2(v, OP_Null, 0, regIns);
    }
    if( ipkColumn>=0 ){
      if( useTempTable ){
        sqlite3VdbeAddOp3(v, OP_Column, srcTab, ipkColumn, regRowid);
      }else if( pSelect ){
        sqlite3VdbeAddOp2(v, OP_Copy, regFromSelect+ipkColumn, regRowid);
      }else{
        Expr *pIpk = pList->a[ipkColumn].pExpr;
        if( pIpk->op==TK_NULL && !IsVirtual(pTab) ){
          sqlite3VdbeAddOp3(v, OP_NewRowid, iDataCur, regRowid, regAutoinc);
          appendFlag = 1;
        }else{
          sqlite3ExprCode(pParse, pList->a[ipkColumn].pExpr, regRowid);
        }
      }
      /* If the PRIMARY KEY expression is NULL, then use OP_NewRowid
      ** to generate a unique primary key value.
      */
      if( !appendFlag ){
        int addr1;
        if( !IsVirtual(pTab) ){
          addr1 = sqlite3VdbeAddOp1(v, OP_NotNull, regRowid); VdbeCoverage(v);
          sqlite3VdbeAddOp3(v, OP_NewRowid, iDataCur, regRowid, regAutoinc);
          sqlite3VdbeJumpHere(v, addr1);
        }else{
          addr1 = sqlite3VdbeCurrentAddr(v);
          sqlite3VdbeAddOp2(v, OP_IsNull, regRowid, addr1+2); VdbeCoverage(v);
        }
        sqlite3VdbeAddOp1(v, OP_MustBeInt, regRowid); VdbeCoverage(v);
      }
    }else if( IsVirtual(pTab) || withoutRowid ){
      sqlite3VdbeAddOp2(v, OP_Null, 0, regRowid);
    }else{
      sqlite3VdbeAddOp3(v, OP_NewRowid, iDataCur, regRowid, regAutoinc);
      appendFlag = 1;
    }
    autoIncStep(pParse, regAutoinc, regRowid);

    /* Compute data for all columns of the new entry, beginning
    ** with the first column.
    */
    nHidden = 0;
    for(i=0; i<pTab->nCol; i++){
      int iRegStore = regRowid+1+i;
      if( i==pTab->iPKey ){
        /* The value of the INTEGER PRIMARY KEY column is always a NULL.
        ** Whenever this column is read, the rowid will be substituted
        ** in its place.  Hence, fill this column with a NULL to avoid
        ** taking up data space with information that will never be used.
        ** As there may be shallow copies of this value, make it a soft-NULL */
        sqlite3VdbeAddOp1(v, OP_SoftNull, iRegStore);
        continue;
      }
      if( pColumn==0 ){
        if( IsHiddenColumn(&pTab->aCol[i]) ){
          j = -1;
          nHidden++;
        }else{
          j = i - nHidden;
        }
      }else{
        for(j=0; j<pColumn->nId; j++){
          if( pColumn->a[j].idx==i ) break;
        }
      }
      if( j<0 || nColumn==0 || (pColumn && j>=pColumn->nId) ){
        sqlite3ExprCodeFactorable(pParse, pTab->aCol[i].pDflt, iRegStore);
      }else if( useTempTable ){
        sqlite3VdbeAddOp3(v, OP_Column, srcTab, j, iRegStore); 
      }else if( pSelect ){
        if( regFromSelect!=regData ){
          sqlite3VdbeAddOp2(v, OP_SCopy, regFromSelect+j, iRegStore);
        }
      }else{
        sqlite3ExprCode(pParse, pList->a[j].pExpr, iRegStore);
      }
    }

    /* Generate code to check constraints and generate index keys and
    ** do the insertion.
    */
#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( IsVirtual(pTab) ){
      const char *pVTab = (const char *)sqlite3GetVTable(db, pTab);
      sqlite3VtabMakeWritable(pParse, pTab);
      sqlite3VdbeAddOp4(v, OP_VUpdate, 1, pTab->nCol+2, regIns, pVTab, P4_VTAB);
      sqlite3VdbeChangeP5(v, onError==OE_Default ? OE_Abort : onError);
      sqlite3MayAbort(pParse);
    }else
#endif
    {
      int isReplace;    /* Set to true if constraints may cause a replace */
      int bUseSeek;     /* True to use OPFLAG_SEEKRESULT */
      sqlite3GenerateConstraintChecks(pParse, pTab, aRegIdx, iDataCur, iIdxCur,
          regIns, 0, ipkColumn>=0, onError, endOfLoop, &isReplace, 0, pUpsert
      );
      sqlite3FkCheck(pParse, pTab, 0, regIns, 0, 0);

      /* Set the OPFLAG_USESEEKRESULT flag if either (a) there are no REPLACE
      ** constraints or (b) there are no triggers and this table is not a
      ** parent table in a foreign key constraint. It is safe to set the
      ** flag in the second case as if any REPLACE constraint is hit, an
      ** OP_Delete or OP_IdxDelete instruction will be executed on each 
      ** cursor that is disturbed. And these instructions both clear the
      ** VdbeCursor.seekResult variable, disabling the OPFLAG_USESEEKRESULT
      ** functionality.  */
      bUseSeek = (isReplace==0 || (pTrigger==0 &&
          ((db->flags & SQLITE_ForeignKeys)==0 || sqlite3FkReferences(pTab)==0)
      ));
      sqlite3CompleteInsertion(pParse, pTab, iDataCur, iIdxCur,
          regIns, aRegIdx, 0, appendFlag, bUseSeek
      );
    }
  }

  /* Update the count of rows that are inserted
  */
  if( regRowCount ){
    sqlite3VdbeAddOp2(v, OP_AddImm, regRowCount, 1);
  }

  if( pTrigger ){
    /* Code AFTER triggers */
    sqlite3CodeRowTrigger(pParse, pTrigger, TK_INSERT, 0, TRIGGER_AFTER, 
        pTab, regData-2-pTab->nCol, onError, endOfLoop);
  }

  /* The bottom of the main insertion loop, if the data source
  ** is a SELECT statement.
  */
  sqlite3VdbeResolveLabel(v, endOfLoop);
  if( useTempTable ){
    sqlite3VdbeAddOp2(v, OP_Next, srcTab, addrCont); VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addrInsTop);
    sqlite3VdbeAddOp1(v, OP_Close, srcTab);
  }else if( pSelect ){
    sqlite3VdbeGoto(v, addrCont);
    sqlite3VdbeJumpHere(v, addrInsTop);
  }

insert_end:
  /* Update the sqlite_sequence table by storing the content of the
  ** maximum rowid counter values recorded while inserting into
  ** autoincrement tables.
  */
  if( pParse->nested==0 && pParse->pTriggerTab==0 ){
    sqlite3AutoincrementEnd(pParse);
  }

  /*
  ** Return the number of rows inserted. If this routine is 
  ** generating code because of a call to sqlite3NestedParse(), do not
  ** invoke the callback function.
  */
  if( regRowCount ){
    sqlite3VdbeAddOp2(v, OP_ResultRow, regRowCount, 1);
    sqlite3VdbeSetNumCols(v, 1);
    sqlite3VdbeSetColName(v, 0, COLNAME_NAME, "rows inserted", SQLITE_STATIC);
  }

insert_cleanup:
  sqlite3SrcListDelete(db, pTabList);
  sqlite3ExprListDelete(db, pList);
  sqlite3UpsertDelete(db, pUpsert);
  sqlite3SelectDelete(db, pSelect);
  sqlite3IdListDelete(db, pColumn);
  sqlite3DbFree(db, aRegIdx);
}